

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall
TimedUdpLayer::receiveUdpPacket(TimedUdpLayer *this,void *data,int *size,sockaddr_in *from)

{
  int iVar1;
  time_t tVar2;
  sockaddr_in *from_local;
  int *size_local;
  void *data_local;
  TimedUdpLayer *this_local;
  
  iVar1 = UdpLayer::receiveUdpPacket(&this->super_UdpLayer,data,size,from);
  if (iVar1 < 1) {
    this_local._4_4_ = -1;
  }
  else {
    if ((this->mActive & 1U) == 0) {
      tVar2 = time((time_t *)0x0);
      if (tVar2 < this->mStartTime) {
        std::operator<<((ostream *)&std::cerr,
                        "TimedUdpLayer::receiveUdpPacket() Dropping packet (Too Early)");
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        *size = 0;
        return -1;
      }
      this->mActive = true;
    }
    this_local._4_4_ = *size;
  }
  return this_local._4_4_;
}

Assistant:

int TimedUdpLayer::receiveUdpPacket(void *data, int *size, struct sockaddr_in &from) {
	if (0 < UdpLayer::receiveUdpPacket(data, size, from)) {
		if (!mActive) {
			if (time(NULL) < mStartTime) {
#ifdef DEBUG_UDP_LAYER 	
#endif
				std::cerr << "TimedUdpLayer::receiveUdpPacket() Dropping packet (Too Early)";
				std::cerr << std::endl;
				//std::cerr << printPkt(data, *size);
				//std::cerr << std::endl;

				*size = 0;
				return -1;
	
			}

			mActive = true;
	
		}

		/* acceptable port */
		return *size;
	}
	return -1;
}